

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall ftxui::SliderBase<long>::~SliderBase(SliderBase<long> *this)

{
  SliderBase<long> *this_local;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__SliderBase_00219d30;
  std::
  unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>::
  ~unique_ptr(&this->captured_mouse_);
  ConstStringRef::~ConstStringRef(&this->label_);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

SliderBase(ConstStringRef label, T* value, T min, T max, T increment)
      : label_(label),
        value_(value),
        min_(min),
        max_(max),
        increment_(increment) {}